

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorTables::FinalizeTables(FileDescriptorTables *this)

{
  default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>
  *pdVar1;
  unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>
  *in_RSI;
  
  pdVar1 = (default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>
            *)(this->fields_by_lowercase_name_tmp_)._M_t.
              super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
              ._M_head_impl;
  (this->fields_by_lowercase_name_tmp_)._M_t.
  super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
  ._M_head_impl =
       (unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>
        *)0x0;
  if (pdVar1 != (default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>
                 *)0x0) {
    std::
    default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::operator()(pdVar1,in_RSI);
  }
  pdVar1 = (default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>
            *)(this->fields_by_camelcase_name_tmp_)._M_t.
              super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
              ._M_head_impl;
  (this->fields_by_camelcase_name_tmp_)._M_t.
  super___uniq_ptr_impl<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_std::default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_*,_false>
  ._M_head_impl =
       (unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>
        *)0x0;
  if (pdVar1 != (default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>
                 *)0x0) {
    std::
    default_delete<std::unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::operator()(pdVar1,in_RSI);
    return;
  }
  return;
}

Assistant:

void FileDescriptorTables::FinalizeTables() {
  // Clean up the temporary maps used by AddFieldByStylizedNames().
  fields_by_lowercase_name_tmp_ = nullptr;
  fields_by_camelcase_name_tmp_ = nullptr;
}